

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::func_type_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type)

{
  ulong *puVar1;
  char **ppcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  bool bVar5;
  undefined8 *puVar6;
  SPIRVariable *var;
  SPIRType *pSVar7;
  SPIREntryPoint *pSVar8;
  size_type sVar9;
  long *plVar10;
  runtime_error *prVar11;
  uint uVar12;
  ulong uVar13;
  size_type *psVar14;
  undefined8 uVar15;
  char (*pacVar16) [12];
  char *pcVar17;
  char (*pacVar18) [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string entry_type;
  string return_type;
  char (*in_stack_ffffffffffffff48) [12];
  string local_b0;
  char **local_90;
  char (*local_88) [12];
  char *local_80;
  undefined8 uStack_78;
  ulong *local_70;
  size_type local_68;
  ulong local_60;
  undefined8 uStack_58;
  char **local_50;
  long local_48;
  char *local_40 [2];
  
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_90,this,type,0);
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&local_b0,this,type);
  pcVar17 = (char *)0xf;
  if (local_90 != &local_80) {
    pcVar17 = local_80;
  }
  pacVar16 = local_88;
  if (pcVar17 < *local_88 + (long)(char *)local_b0._M_string_length) {
    uVar15 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar15 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < *local_88 + (long)(char *)local_b0._M_string_length) goto LAB_002708bc;
    puVar6 = (undefined8 *)
             ::std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_002708bc:
    puVar6 = (undefined8 *)
             ::std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b0._M_dataplus._M_p);
  }
  local_70 = &local_60;
  puVar1 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar1) {
    local_60 = *puVar1;
    uStack_58 = puVar6[3];
  }
  else {
    local_60 = *puVar1;
    local_70 = (ulong *)*puVar6;
  }
  local_68 = puVar6[1];
  *puVar6 = puVar1;
  puVar6[1] = 0;
  *(undefined1 *)puVar1 = 0;
  paVar3 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((this->super_CompilerGLSL).processing_entry_point == false) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_70 == &local_60) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_60;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_58;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_70;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = local_60;
    }
    __return_storage_ptr__->_M_string_length = local_68;
    local_68 = 0;
    local_60 = local_60 & 0xffffffffffffff00;
    local_70 = &local_60;
    goto LAB_00270c86;
  }
  bVar5 = get_is_rasterization_disabled(this);
  uVar13 = (ulong)(this->stage_out_var_id).id;
  if (!bVar5 && uVar13 != 0) {
    var = Variant::get<spirv_cross::SPIRVariable>
                    ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                     super_VectorView<spirv_cross::Variant>.ptr + uVar13);
    pSVar7 = Compiler::get_variable_data_type((Compiler *)this,var);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_b0,this,pSVar7,0);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x23])(&local_50,this,type);
    uVar15 = (char *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar3) {
      uVar15 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar15 < (char *)local_b0._M_string_length + local_48) {
      pcVar17 = (char *)0xf;
      if (local_50 != local_40) {
        pcVar17 = local_40[0];
      }
      if (pcVar17 < (char *)local_b0._M_string_length + local_48) goto LAB_002709f7;
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::replace
                         ((ulong)&local_50,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
      pacVar16 = (char (*) [12])local_b0._M_string_length;
    }
    else {
LAB_002709f7:
      puVar6 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_50);
      pacVar16 = (char (*) [12])local_b0._M_string_length;
    }
    ppcVar2 = (char **)(puVar6 + 2);
    if ((char **)*puVar6 == ppcVar2) {
      local_80 = *ppcVar2;
      uStack_78 = puVar6[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *ppcVar2;
      local_90 = (char **)*puVar6;
    }
    local_88 = (char (*) [12])puVar6[1];
    *puVar6 = ppcVar2;
    puVar6[1] = 0;
    *(undefined1 *)ppcVar2 = 0;
    ::std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar3) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  local_88 = (char (*) [12])0x0;
  local_80 = (char *)((ulong)local_80 & 0xffffffffffffff00);
  local_90 = &local_80;
  pSVar8 = Compiler::get_entry_point((Compiler *)this);
  pacVar18 = local_88;
  switch(pSVar8->model) {
  case ExecutionModelVertex:
    bVar5 = (this->msl_options).vertex_for_tessellation;
    if ((bVar5 == true) && ((this->msl_options).msl_version < 0x27d8)) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Tessellation requires Metal 1.2.","");
      ::std::runtime_error::runtime_error(prVar11,(string *)&local_b0);
      *(undefined ***)prVar11 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(prVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pcVar17 = "vertex";
    if (bVar5 != false) {
      pcVar17 = "kernel";
    }
    break;
  case ExecutionModelTessellationControl:
    if ((this->msl_options).msl_version < 0x27d8) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Tessellation requires Metal 1.2.","");
      ::std::runtime_error::runtime_error(prVar11,(string *)&local_b0);
      *(undefined ***)prVar11 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(prVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (((pSVar8->flags).lower & 0x2000000) != 0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Metal does not support isoline tessellation.","");
      ::std::runtime_error::runtime_error(prVar11,(string *)&local_b0);
      *(undefined ***)prVar11 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(prVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
  case ExecutionModelGLCompute:
  case ExecutionModelKernel:
    pcVar17 = "kernel";
    break;
  case ExecutionModelTessellationEvaluation:
    if ((this->msl_options).msl_version < 0x27d8) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Tessellation requires Metal 1.2.","");
      ::std::runtime_error::runtime_error(prVar11,(string *)&local_b0);
      *(undefined ***)prVar11 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(prVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    uVar12 = (uint)(pSVar8->flags).lower;
    if ((uVar12 >> 0x19 & 1) != 0) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_b0._M_dataplus._M_p = (pointer)paVar3;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Metal does not support isoline tessellation.","");
      ::std::runtime_error::runtime_error(prVar11,(string *)&local_b0);
      *(undefined ***)prVar11 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(prVar11,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_50 = (char **)0x2f58df;
    if ((uVar12 >> 0x16 & 1) == 0) {
      local_50 = (char **)0x2e17be;
    }
    if ((this->msl_options).platform == iOS) {
      join<char_const(&)[10],char_const*,char_const(&)[12]>
                (&local_b0,(spirv_cross *)"[[ patch(",(char (*) [10])&local_50,
                 (char **)") ]] vertex",pacVar16);
    }
    else {
      join<char_const(&)[10],char_const*,char_const(&)[3],unsigned_int&,char_const(&)[12]>
                (&local_b0,(spirv_cross *)"[[ patch(",(char (*) [10])&local_50,(char **)0x2f4768,
                 (char (*) [3])&pSVar8->output_vertices,(uint *)") ]] vertex",
                 in_stack_ffffffffffffff48);
    }
    ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar3) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    goto LAB_00270bea;
  default:
    pcVar17 = "unknown";
    break;
  case ExecutionModelFragment:
    if (((pSVar8->flags).lower & 0x200) == 0) {
      local_b0._M_dataplus._M_p._0_4_ = 0x115e;
      sVar9 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(pSVar8->flags).higher._M_h,(key_type *)&local_b0);
      pcVar17 = "[[ early_fragment_tests ]] fragment";
      if (sVar9 == 0) {
        pcVar17 = "fragment";
      }
    }
    else {
      pcVar17 = "[[ early_fragment_tests ]] fragment";
    }
    pacVar18 = local_88;
    strlen(pcVar17);
  }
  ::std::__cxx11::string::_M_replace((ulong)&local_90,0,*pacVar18,(ulong)pcVar17);
LAB_00270bea:
  local_b0._M_dataplus._M_p = (pointer)paVar3;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,local_90,*local_88 + (long)local_90);
  ::std::__cxx11::string::append((char *)&local_b0);
  plVar10 = (long *)::std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar14 = (size_type *)(plVar10 + 2);
  if ((size_type *)*plVar10 == psVar14) {
    lVar4 = plVar10[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar10;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar14;
  }
  __return_storage_ptr__->_M_string_length = plVar10[1];
  *plVar10 = (long)psVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
LAB_00270c86:
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::func_type_decl(SPIRType &type)
{
	// The regular function return type. If not processing the entry point function, that's all we need
	string return_type = type_to_glsl(type) + type_to_array_glsl(type);
	if (!processing_entry_point)
		return return_type;

	// If an outgoing interface block has been defined, and it should be returned, override the entry point return type
	bool ep_should_return_output = !get_is_rasterization_disabled();
	if (stage_out_var_id && ep_should_return_output)
		return_type = type_to_glsl(get_stage_out_struct_type()) + type_to_array_glsl(type);

	// Prepend a entry type, based on the execution model
	string entry_type;
	auto &execution = get_entry_point();
	switch (execution.model)
	{
	case ExecutionModelVertex:
		if (msl_options.vertex_for_tessellation && !msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		entry_type = msl_options.vertex_for_tessellation ? "kernel" : "vertex";
		break;
	case ExecutionModelTessellationEvaluation:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		if (msl_options.is_ios())
			entry_type =
			    join("[[ patch(", execution.flags.get(ExecutionModeTriangles) ? "triangle" : "quad", ") ]] vertex");
		else
			entry_type = join("[[ patch(", execution.flags.get(ExecutionModeTriangles) ? "triangle" : "quad", ", ",
			                  execution.output_vertices, ") ]] vertex");
		break;
	case ExecutionModelFragment:
		entry_type = execution.flags.get(ExecutionModeEarlyFragmentTests) ||
		                     execution.flags.get(ExecutionModePostDepthCoverage) ?
		                 "[[ early_fragment_tests ]] fragment" :
		                 "fragment";
		break;
	case ExecutionModelTessellationControl:
		if (!msl_options.supports_msl_version(1, 2))
			SPIRV_CROSS_THROW("Tessellation requires Metal 1.2.");
		if (execution.flags.get(ExecutionModeIsolines))
			SPIRV_CROSS_THROW("Metal does not support isoline tessellation.");
		/* fallthrough */
	case ExecutionModelGLCompute:
	case ExecutionModelKernel:
		entry_type = "kernel";
		break;
	default:
		entry_type = "unknown";
		break;
	}

	return entry_type + " " + return_type;
}